

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::TryRemovePrefix
                   (string *__return_storage_ptr__,string *prefix,string *value)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  ulong local_70;
  size_t value_index;
  size_t prefix_index;
  size_t i;
  allocator<char> local_41;
  string local_40 [8];
  string prefix_to_match;
  string *value_local;
  string *prefix_local;
  
  prefix_to_match.field_2._8_8_ = value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  for (prefix_index = 0; uVar2 = std::__cxx11::string::size(), prefix_index < uVar2;
      prefix_index = prefix_index + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)prefix);
    if (*pcVar3 != '_') {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)prefix);
      cVar1 = ascii_tolower(*pcVar3);
      std::__cxx11::string::operator+=(local_40,cVar1);
    }
  }
  value_index = 0;
  local_70 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    bVar4 = false;
    if (value_index < uVar2) {
      uVar2 = std::__cxx11::string::size();
      bVar4 = local_70 < uVar2;
    }
    if (!bVar4) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](prefix_to_match.field_2._8_8_);
    if (*pcVar3 != '_') {
      pcVar3 = (char *)std::__cxx11::string::operator[](prefix_to_match.field_2._8_8_);
      cVar1 = ascii_tolower(*pcVar3);
      value_index = value_index + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (cVar1 != *pcVar3) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)prefix_to_match.field_2._8_8_);
LAB_0037d714:
        std::__cxx11::string::~string(local_40);
        return __return_storage_ptr__;
      }
    }
    local_70 = local_70 + 1;
  }
  uVar2 = std::__cxx11::string::size();
  if (value_index < uVar2) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)prefix_to_match.field_2._8_8_);
  }
  else {
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_70 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[](prefix_to_match.field_2._8_8_);
        bVar4 = *pcVar3 == '_';
      }
      if (!bVar4) break;
      local_70 = local_70 + 1;
    }
    uVar2 = std::__cxx11::string::size();
    if (local_70 == uVar2) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)prefix_to_match.field_2._8_8_);
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,prefix_to_match.field_2._8_8_);
    }
  }
  goto LAB_0037d714;
}

Assistant:

std::string TryRemovePrefix(const std::string& prefix, const std::string& value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += ascii_tolower(prefix[i]);
    }
  }
  
  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
      prefix_index < prefix_to_match.size() && value_index < value.size();
      value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (ascii_tolower(value[value_index]) != prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return value;
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return value;
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores afterwards), don't strip.
  if (value_index == value.size()) {
    return value;
  }

  return value.substr(value_index);
}